

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void compile_dnref_search(compiler_common *common,PCRE2_SPTR16 cc,jump_list **backtracks)

{
  ushort uVar1;
  sljit_compiler *compiler;
  jump_list *list;
  jump_list **list_00;
  sljit_jump *psVar2;
  sljit_label *label;
  sljit_sw offset;
  uint uVar3;
  ushort *puVar4;
  jump_list *found;
  jump_list **local_38;
  
  compiler = common->compiler;
  uVar1 = cc[2];
  puVar4 = common->name_table + (ulong)cc[1] * common->name_entry_size;
  found = (jump_list *)0x0;
  offset = 0;
  local_38 = backtracks;
  sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->ovector_start + 8);
  for (uVar3 = (uint)uVar1; 1 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar1 = *puVar4;
    sljit_get_local_base(compiler,4,(long)common->ovector_start + (ulong)uVar1 * 0x10,offset);
    offset = (long)common->ovector_start + (ulong)uVar1 * 0x10;
    psVar2 = sljit_emit_cmp(compiler,1,0x8e,offset,1,0);
    add_jump(compiler,&found,psVar2);
    puVar4 = puVar4 + common->name_entry_size;
  }
  uVar1 = *puVar4;
  sljit_get_local_base(compiler,4,(long)common->ovector_start + (ulong)uVar1 * 0x10,offset);
  list_00 = local_38;
  if ((local_38 != (jump_list **)0x0) && (common->unset_backref == 0)) {
    psVar2 = sljit_emit_cmp(compiler,0,0x8e,(ulong)uVar1 * 0x10 + (long)common->ovector_start,1,0);
    add_jump(compiler,list_00,psVar2);
  }
  list = found;
  label = sljit_emit_label(compiler);
  set_jumps(list,label);
  return;
}

Assistant:

static void compile_dnref_search(compiler_common *common, PCRE2_SPTR cc, jump_list **backtracks)
{
/* The OVECTOR offset goes to TMP2. */
DEFINE_COMPILER;
int count = GET2(cc, 1 + IMM2_SIZE);
PCRE2_SPTR slot = common->name_table + GET2(cc, 1) * common->name_entry_size;
unsigned int offset;
jump_list *found = NULL;

SLJIT_ASSERT(*cc == OP_DNREF || *cc == OP_DNREFI);

OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1));

count--;
while (count-- > 0)
  {
  offset = GET2(slot, 0) << 1;
  GET_LOCAL_BASE(TMP2, 0, OVECTOR(offset));
  add_jump(compiler, &found, CMP(SLJIT_NOT_EQUAL, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0));
  slot += common->name_entry_size;
  }

offset = GET2(slot, 0) << 1;
GET_LOCAL_BASE(TMP2, 0, OVECTOR(offset));
if (backtracks != NULL && !common->unset_backref)
  add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0));

set_jumps(found, LABEL());
}